

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

int Dau_ParseFormulaAig_rec(Gia_Man_t *p,char *pBeg,char *pEnd)

{
  char cVar1;
  int iVar2;
  int iLit1;
  char *pcVar3;
  char *pEnd_00;
  uint local_44;
  int fCompl;
  char *pEndNew;
  int Oper;
  int Res;
  int iFans [2];
  char *pEnd_local;
  char *pBeg_local;
  Gia_Man_t *p_local;
  
  local_44 = 0;
  for (pEnd_local = pBeg; *pEnd_local == '~'; pEnd_local = pEnd_local + 1) {
    local_44 = local_44 ^ 1;
  }
  if (pEnd_local + 1 == pEnd) {
    if ((*pEnd_local < 'a') || ('f' < *pEnd_local)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                    ,0xb3,"int Dau_ParseFormulaAig_rec(Gia_Man_t *, char *, char *)");
    }
    p_local._4_4_ = Abc_Var2Lit(*pEnd_local + -0x60,local_44);
  }
  else if ((*pEnd_local == '(') && (pcVar3 = Dau_ParseFormulaEndToken(pEnd_local), pcVar3 == pEnd))
  {
    if (*pEnd_local != '(') {
      __assert_fail("pBeg[0] == \'(\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                    ,0xbb,"int Dau_ParseFormulaAig_rec(Gia_Man_t *, char *, char *)");
    }
    if (pEnd[-1] != ')') {
      __assert_fail("pBeg[pEnd-pBeg-1] == \')\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                    ,0xbc,"int Dau_ParseFormulaAig_rec(Gia_Man_t *, char *, char *)");
    }
    iVar2 = Dau_ParseFormulaAig_rec(p,pEnd_local + 1,pEnd + -1);
    p_local._4_4_ = Abc_LitNotCond(iVar2,local_44);
  }
  else {
    pcVar3 = Dau_ParseFormulaEndToken(pEnd_local);
    iVar2 = Dau_ParseFormulaAig_rec(p,pEnd_local,pcVar3);
    iVar2 = Abc_LitNotCond(iVar2,local_44);
    cVar1 = *pcVar3;
    pEnd_00 = Dau_ParseFormulaEndToken(pcVar3 + 1);
    iLit1 = Dau_ParseFormulaAig_rec(p,pcVar3 + 1,pEnd_00);
    if (cVar1 == '&') {
      p_local._4_4_ = Gia_ManHashAnd(p,iVar2,iLit1);
    }
    else {
      if (cVar1 != '^') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                      ,0xcf,"int Dau_ParseFormulaAig_rec(Gia_Man_t *, char *, char *)");
      }
      p_local._4_4_ = Gia_ManHashXor(p,iVar2,iLit1);
    }
  }
  return p_local._4_4_;
}

Assistant:

int Dau_ParseFormulaAig_rec( Gia_Man_t * p, char * pBeg, char * pEnd )
{
    int iFans[2], Res, Oper = -1;
    char * pEndNew;
    int fCompl = 0;
    while ( pBeg[0] == '~' )
    {
        pBeg++;
        fCompl ^= 1;
    }
    if ( pBeg + 1 == pEnd )
    {
        if ( pBeg[0] >= 'a' && pBeg[0] <= 'f' )
            return Abc_Var2Lit( 1 + pBeg[0] - 'a', fCompl );
        assert( 0 );
        return -1;
    }
    if ( pBeg[0] == '(' )
    {
        pEndNew = Dau_ParseFormulaEndToken( pBeg );
        if ( pEndNew == pEnd )
        {
            assert( pBeg[0] == '(' );
            assert( pBeg[pEnd-pBeg-1] == ')' );
            Res = Dau_ParseFormulaAig_rec( p, pBeg + 1, pEnd - 1 );
            return Abc_LitNotCond( Res, fCompl );
        }
    }
    // get first part
    pEndNew  = Dau_ParseFormulaEndToken( pBeg );
    iFans[0] = Dau_ParseFormulaAig_rec( p, pBeg, pEndNew );
    iFans[0] = Abc_LitNotCond( iFans[0], fCompl );
    Oper     = pEndNew[0];
    // get second part
    pBeg     = pEndNew + 1;
    pEndNew  = Dau_ParseFormulaEndToken( pBeg );
    iFans[1] = Dau_ParseFormulaAig_rec( p, pBeg, pEndNew );
    // derive the formula
    if ( Oper == '&' )
        return Gia_ManHashAnd( p, iFans[0], iFans[1] );
    if ( Oper == '^' )
        return Gia_ManHashXor( p, iFans[0], iFans[1] );
    assert( 0 );
    return -1;
}